

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O3

ssize_t __thiscall gguf_writer::write(gguf_writer *this,int __fd,void *__buf,size_t __n)

{
  gguf_type gVar1;
  ulong extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ulong uVar3;
  bool *pbVar4;
  ulong extraout_RAX_00;
  size_t __n_00;
  void *__buf_00;
  void *__buf_01;
  undefined4 in_register_00000034;
  gguf_kv *this_00;
  size_t sVar5;
  uint64_t ne;
  gguf_type local_2c;
  size_t local_28;
  
  this_00 = (gguf_kv *)CONCAT44(in_register_00000034,__fd);
  local_28 = ::gguf_kv::get_ne(this_00);
  write(this,__fd,__buf_00,__n);
  if (this_00->is_array == true) {
    local_2c = GGUF_TYPE_ARRAY;
    write<int>(this,(int *)&local_2c);
    local_2c = this_00->type;
    write<int>(this,(int *)&local_2c);
    write<unsigned_long>(this,&local_28);
  }
  else {
    local_2c = this_00->type;
    write<int>(this,(int *)&local_2c);
  }
  gVar1 = this_00->type;
  uVar3 = (ulong)gVar1;
  if (GGUF_TYPE_FLOAT64 < gVar1) {
LAB_00141707:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
               ,0x4c5,"invalid type");
  }
  __n_00 = 0x1c7f;
  if ((0x1c7fU >> (gVar1 & 0x1f) & 1) == 0) {
    if (gVar1 == GGUF_TYPE_BOOL) {
      if (local_28 != 0) {
        sVar5 = 0;
        do {
          pbVar4 = ::gguf_kv::get_val<bool>(this_00,sVar5);
          local_2c = CONCAT31(local_2c._1_3_,*pbVar4);
          write<signed_char>(this,(char *)&local_2c);
          sVar5 = sVar5 + 1;
          uVar3 = extraout_RAX_00;
        } while (sVar5 < local_28);
      }
    }
    else {
      if (gVar1 != GGUF_TYPE_STRING) goto LAB_00141707;
      if (local_28 != 0) {
        sVar5 = 0;
        do {
          pbVar2 = ::gguf_kv::get_val<std::__cxx11::string>(this_00,sVar5);
          uVar3 = write(this,(int)pbVar2,__buf_01,__n_00);
          sVar5 = sVar5 + 1;
        } while (sVar5 < local_28);
      }
    }
  }
  else {
    std::vector<signed_char,std::allocator<signed_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<signed_char_const*,std::vector<signed_char,std::allocator<signed_char>>>>
              ((vector<signed_char,std::allocator<signed_char>> *)this->buf,
               *(undefined8 *)((vector<signed_char,std::allocator<signed_char>> *)this->buf + 8),
               (this_00->data).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
               .super__Vector_impl_data._M_start,
               (this_00->data).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
               .super__Vector_impl_data._M_finish);
    uVar3 = extraout_RAX;
  }
  return uVar3;
}

Assistant:

void write(const struct gguf_kv & kv) const {
        const uint64_t ne = kv.get_ne();

        write(kv.get_key());

        if (kv.is_array) {
            write(GGUF_TYPE_ARRAY);
            write(kv.get_type());
            write(ne);
        } else {
            write(kv.get_type());
        }

        switch (kv.get_type()) {
            case GGUF_TYPE_UINT8:
            case GGUF_TYPE_INT8:
            case GGUF_TYPE_UINT16:
            case GGUF_TYPE_INT16:
            case GGUF_TYPE_UINT32:
            case GGUF_TYPE_INT32:
            case GGUF_TYPE_FLOAT32:
            case GGUF_TYPE_UINT64:
            case GGUF_TYPE_INT64:
            case GGUF_TYPE_FLOAT64: {
                write(kv.data);
            } break;
            case GGUF_TYPE_BOOL: {
                for (size_t i = 0; i < ne; ++i) {
                    write(kv.get_val<bool>(i));
                }
            } break;
            case GGUF_TYPE_STRING: {
                for (size_t i = 0; i < ne; ++i) {
                    write(kv.get_val<std::string>(i));
                }
            } break;
            case GGUF_TYPE_ARRAY:
            default: GGML_ABORT("invalid type");
        }
    }